

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall Polymer::Polymer(Polymer *this,string *name,int start,int stop)

{
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  interaction_map;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_118;
  undefined1 local_e8 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  _Alloc_hider _Stack_d0;
  _Base_ptr local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  pointer ppStack_b0;
  _Alloc_hider local_a8;
  double local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  pointer local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_80 [5];
  
  (this->super_enable_shared_from_this<Polymer>)._M_weak_this.
  super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Polymer>)._M_weak_this.
  super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Polymer = (_func_int **)&PTR_Initialize_0019d890;
  p_Var1 = &(this->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header;
  (this->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->termination_signal_).current_id_ = 0;
  (this->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  this->start_ = start;
  this->stop_ = stop;
  (this->polymerases_).prop_sum_ = 0.0;
  (this->polymerases_).pol_count_ = 0;
  (this->polymerases_).prop_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->polymerases_).prop_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->polymerases_).prop_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->polymerases_).polymerases_.
  super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->polymerases_).polymerases_.
  super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->polymerases_).polymerases_.
  super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->polymerases_).seq_._M_dataplus._M_p = (pointer)&(this->polymerases_).seq_.field_2;
  (this->polymerases_).seq_._M_string_length = 0;
  (this->polymerases_).seq_.field_2._M_local_buf[0] = '\0';
  (this->polymerases_).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->polymerases_).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->polymerases_).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->degrade_ = false;
  this->attached_ = false;
  memset(&this->binding_intervals_,0,0x90);
  _Stack_d0._M_p = local_e8 + 8;
  local_e8._0_8_ = (_func_int **)0x0;
  local_e8._8_8_ = (element_type *)0x0;
  local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  aStack_c0._M_allocated_capacity = 0;
  local_c8 = (_Base_ptr)_Stack_d0._M_p;
  Mask::Mask(&this->mask_,0,0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)local_e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *)local_e8);
  p_Var1 = &(this->uncovered_)._M_t._M_impl.super__Rb_tree_header;
  (this->uncovered_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->uncovered_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->uncovered_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->uncovered_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->uncovered_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._0_8_ = (_func_int **)0x0;
  local_e8._8_8_ = local_e8._8_8_ & 0xffffffff00000000;
  local_a8._M_p = (pointer)&local_98;
  local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_d0._M_p = (pointer)0x0;
  local_c8 = (_Base_ptr)0x0;
  aStack_c0._M_allocated_capacity = 0;
  aStack_c0._8_8_ = (pointer)0x0;
  ppStack_b0 = (pointer)0x0;
  local_a0 = 0.0;
  local_98._M_local_buf[0] = '\0';
  local_88 = (pointer)0x0;
  aaStack_80[0]._M_allocated_capacity = (pointer)0x0;
  aaStack_80[0]._8_8_ = (pointer)0x0;
  MobileElementManager::operator=(&this->polymerases_,(MobileElementManager *)local_e8);
  MobileElementManager::~MobileElementManager((MobileElementManager *)local_e8);
  local_118._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118._M_impl.super__Rb_tree_header._M_header;
  local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118._M_impl.super__Rb_tree_header._M_header._M_left;
  Mask::Mask((Mask *)local_e8,this->stop_ + 1,this->stop_,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&local_118);
  Mask::operator=(&this->mask_,(Mask *)local_e8);
  Mask::~Mask((Mask *)local_e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_118);
  return;
}

Assistant:

Polymer::Polymer(const std::string &name, int start, int stop)
    : name_(name),
      start_(start),
      stop_(stop) {
  polymerases_ = MobileElementManager();
  std::map<std::string, double> interaction_map;
  mask_ = Mask(stop_ + 1, stop_, interaction_map);
}